

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O2

Vec_Int_t *
Gia_ManFxTopoOrder(Vec_Wec_t *vCubes,int nInputs,int nStart,Vec_Int_t **pvFirst,Vec_Int_t **pvCount)

{
  int iVar1;
  uint i;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vFirst;
  Vec_Int_t *vCount;
  Vec_Int_t *p;
  int iVar4;
  int iVar5;
  
  iVar4 = -1;
  for (iVar5 = 0; iVar5 < vCubes->nSize; iVar5 = iVar5 + 1) {
    pVVar3 = Vec_WecEntry(vCubes,iVar5);
    iVar1 = Vec_IntEntry(pVVar3,0);
    if (iVar4 <= iVar1) {
      iVar4 = iVar1;
    }
  }
  iVar5 = iVar4 + 1;
  pVVar3 = (Vec_Int_t *)0x0;
  if (iVar5 != nStart) {
    vFirst = Vec_IntStart(iVar5);
    vCount = Vec_IntStart(iVar5);
    while (iVar1 = (int)pVVar3, iVar1 < vCubes->nSize) {
      pVVar3 = Vec_WecEntry(vCubes,iVar1);
      i = Vec_IntEntry(pVVar3,0);
      if ((int)i < nInputs) {
        __assert_fail("iFanin >= nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                      ,0x126,
                      "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                     );
      }
      iVar2 = Vec_IntEntry(vCount,i);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(vFirst,i,iVar1);
      }
      if (((int)i < 0) || (vCount->nSize <= (int)i)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      vCount->pArray[i] = vCount->pArray[i] + 1;
      pVVar3 = (Vec_Int_t *)(ulong)(iVar1 + 1);
    }
    pVVar3 = Vec_IntStart(nInputs);
    p = Vec_IntStart(iVar5);
    iVar2 = 0;
    iVar1 = 0;
    if (0 < nInputs) {
      iVar1 = nInputs;
    }
    for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      Vec_IntWriteEntry(p,iVar2,1);
    }
    for (; nInputs <= iVar4; nInputs = nInputs + 1) {
      iVar1 = Vec_IntEntry(p,nInputs);
      if (iVar1 == 0) {
        Gia_ManFxTopoOrder_rec(vCubes,vFirst,vCount,p,pVVar3,nInputs);
      }
    }
    if (pVVar3->nSize != iVar5) {
      __assert_fail("Vec_IntSize(vOrder) == nNodeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                    ,0x133,
                    "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                   );
    }
    Vec_IntFree(p);
    *pvFirst = vFirst;
    *pvCount = vCount;
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ManFxTopoOrder( Vec_Wec_t * vCubes, int nInputs, int nStart, Vec_Int_t ** pvFirst, Vec_Int_t ** pvCount )
{
    Vec_Int_t * vOrder, * vFirst, * vCount, * vVisit, * vCube;
    int i, iFanin, nNodeMax = -1;
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        nNodeMax = Abc_MaxInt( nNodeMax, Vec_IntEntry(vCube, 0) );
    nNodeMax++;
    // quit if there is no new nodes
    if ( nNodeMax == nStart )
    {
        //printf( "The network is unchanged by fast extract.\n" );
        return NULL;
    }
    // find first cube and how many cubes
    vFirst = Vec_IntStart( nNodeMax );
    vCount = Vec_IntStart( nNodeMax );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        assert( iFanin >= nInputs );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // put all of them in a topo order
    vOrder = Vec_IntStart( nInputs );
    vVisit = Vec_IntStart( nNodeMax );
    for ( i = 0; i < nInputs; i++ )
        Vec_IntWriteEntry( vVisit, i, 1 );
    for ( i = nInputs; i < nNodeMax; i++ )
        if ( !Vec_IntEntry( vVisit, i ) )
            Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, i );
    assert( Vec_IntSize(vOrder) == nNodeMax );
    Vec_IntFree( vVisit );
    // return topological order of new nodes
    *pvFirst = vFirst;
    *pvCount = vCount;
    return vOrder;
}